

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseDataModuleField(WastParser *this,Module *module)

{
  string_view name_00;
  bool bVar1;
  Result RVar2;
  tuple<wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_> tVar3;
  Enum EVar4;
  Location loc;
  string name;
  __uniq_ptr_impl<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
  local_e0;
  Location local_d8;
  Token local_b8;
  Var local_78;
  
  RVar2 = Expect(this,Lpar);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  GetToken(&local_b8,this);
  local_d8.field_1.field_1.offset._1_7_ = local_b8.loc.field_1.field_1.offset._1_7_;
  local_d8.field_1.field2[0] = local_b8.loc.field_1.field2[0];
  local_d8.field_1._8_8_ = local_b8.loc.field_1._8_8_;
  local_d8.filename.data_ = local_b8.loc.filename.data_;
  local_d8.filename.size_ = local_b8.loc.filename.size_;
  RVar2 = Expect(this,Data);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  local_b8.loc.filename.data_ = (char *)&local_b8.loc.field_1;
  local_b8.loc.filename.size_ = 0;
  local_b8.loc.field_1.field2[0] = 0;
  ParseBindVarOpt(this,(string *)&local_b8);
  tVar3.
  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
        )operator_new(0xe0);
  name_00.size_ = local_b8.loc.filename.size_;
  name_00.data_ = local_b8.loc.filename.data_;
  *(long *)((long)tVar3.
                  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 8) =
       0;
  *(long *)((long)tVar3.
                  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x10)
       = 0;
  *(char **)((long)tVar3.
                   super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                   .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x18
            ) = local_d8.filename.data_;
  *(size_type *)
   ((long)tVar3.
          super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
          .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x20) =
       local_d8.filename.size_;
  ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
  ((long)tVar3.
         super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
         .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x28))->offset
       = (size_t)local_d8.field_1.field_1.offset;
  *(undefined8 *)
   ((long)tVar3.
          super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
          .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x30) =
       local_d8.field_1._8_8_;
  *(undefined4 *)
   ((long)tVar3.
          super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
          .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x38) = 8;
  *(undefined ***)
   tVar3.
   super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
   .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl =
       &PTR__DataSegmentModuleField_001c2078;
  DataSegment::DataSegment
            ((DataSegment *)
             ((long)tVar3.
                    super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                    .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl +
             0x40),name_00);
  bVar1 = PeekMatchLpar(this,Memory);
  if (bVar1) {
    RVar2 = Expect(this,Lpar);
    if ((((RVar2.enum_ != Error) && (RVar2 = Expect(this,Memory), RVar2.enum_ != Error)) &&
        (RVar2 = ParseVar(this,(Var *)((long)tVar3.
                                             super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                                             .
                                             super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>
                                             ._M_head_impl + 0x68)), RVar2.enum_ != Error)) &&
       ((RVar2 = Expect(this,Rpar), RVar2.enum_ != Error &&
        (RVar2 = ParseOffsetExpr(this,(ExprList *)
                                      ((long)tVar3.
                                             super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                                             .
                                             super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>
                                             ._M_head_impl + 0xb0)), RVar2.enum_ != Error))))
    goto LAB_001646bb;
  }
  else {
    Var::Var(&local_78,0,&local_d8);
    bVar1 = ParseVarOpt(this,(Var *)((long)tVar3.
                                           super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                                           .
                                           super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>
                                           ._M_head_impl + 0x68),&local_78);
    Var::~Var(&local_78);
    if (bVar1) {
      RVar2 = ParseOffsetExpr(this,(ExprList *)
                                   ((long)tVar3.
                                          super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                                          .
                                          super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>
                                          ._M_head_impl + 0xb0));
      if (RVar2.enum_ == Error) goto LAB_00164731;
    }
    else {
      bVar1 = ParseOffsetExprOpt(this,(ExprList *)
                                      ((long)tVar3.
                                             super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                                             .
                                             super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>
                                             ._M_head_impl + 0xb0));
      if (!bVar1) {
        if ((this->options_->features).bulk_memory_enabled_ == false) {
          Error(this,0x19bb13);
          goto LAB_00164731;
        }
        ((DataSegment *)
        ((long)tVar3.
               super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
               .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x40))->
        kind = Passive;
      }
    }
LAB_001646bb:
    ParseTextListOpt(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          ((long)tVar3.
                                 super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                                 .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>.
                                 _M_head_impl + 200));
    RVar2 = Expect(this,Rpar);
    if (RVar2.enum_ != Error) {
      local_e0._M_t.
      super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
      .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl =
           (tuple<wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
            )(tuple<wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
              )tVar3.
               super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
               .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl;
      Module::AppendField(module,(unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                                  *)&local_e0);
      if ((_Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
           )local_e0._M_t.
            super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
            .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl !=
          (DataSegmentModuleField *)0x0) {
        (**(code **)(*(long *)local_e0._M_t.
                              super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                              .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>.
                              _M_head_impl + 8))();
      }
      local_e0._M_t.
      super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
      .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl =
           (tuple<wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
            )(_Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
              )0x0;
      EVar4 = Ok;
      goto LAB_0016473f;
    }
  }
LAB_00164731:
  (**(code **)(*(long *)tVar3.
                        super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                        .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl +
              8))(tVar3.
                  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl);
  EVar4 = Error;
LAB_0016473f:
  if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_b8.loc.filename.data_ !=
      &local_b8.loc.field_1) {
    operator_delete(local_b8.loc.filename.data_);
  }
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseDataModuleField(Module* module) {
  WABT_TRACE(ParseDataModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Data);
  std::string name;
  ParseBindVarOpt(&name);
  auto field = MakeUnique<DataSegmentModuleField>(loc, name);

  if (PeekMatchLpar(TokenType::Memory)) {
    EXPECT(Lpar);
    EXPECT(Memory);
    CHECK_RESULT(ParseVar(&field->data_segment.memory_var));
    EXPECT(Rpar);
    CHECK_RESULT(ParseOffsetExpr(&field->data_segment.offset));
  } else if (ParseVarOpt(&field->data_segment.memory_var, Var(0, loc))) {
    CHECK_RESULT(ParseOffsetExpr(&field->data_segment.offset));
  } else if (!ParseOffsetExprOpt(&field->data_segment.offset)) {
    if (!options_->features.bulk_memory_enabled()) {
      Error(loc, "passive data segments are not allowed");
      return Result::Error;
    }

    field->data_segment.kind = SegmentKind::Passive;
  }

  ParseTextListOpt(&field->data_segment.data);
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}